

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_oct.c
# Opt level: O2

REF_STATUS
ref_oct_set_node_at_node
          (REF_OCT ref_oct,REF_INT node,REF_DBL *bbox,REF_INT insert_node,REF_DBL *xyz)

{
  REF_STATUS RVar1;
  undefined8 uVar2;
  long lVar3;
  char *pcVar4;
  REF_BOOL overlap;
  REF_DBL h;
  REF_DBL box [6];
  REF_DBL local_98;
  REF_DBL local_90;
  REF_DBL RStack_88;
  REF_DBL local_80;
  REF_DBL local_78;
  REF_DBL local_70;
  REF_DBL fuzz [6];
  
  local_98 = *xyz;
  RStack_88 = xyz[1];
  local_78 = xyz[2];
  local_90 = local_98;
  local_80 = RStack_88;
  local_70 = local_78;
  ref_oct_bbox_scale(bbox,1.01,fuzz);
  ref_oct_bbox_overlap(&local_98,fuzz,&overlap);
  if (overlap != 0) {
    if (ref_oct->children[node * 8] == -1) {
      ref_oct_bbox_diag(bbox,&h);
      for (lVar3 = 0; lVar3 != 0x1b; lVar3 = lVar3 + 1) {
        RVar1 = ref_oct_bbox_corner(bbox,(REF_INT)lVar3,box);
        if (RVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",
                 0x1b6,"ref_oct_set_node_at_node",1,"corner xyz");
          return 1;
        }
        if (SQRT((xyz[2] - box[2]) * (xyz[2] - box[2]) +
                 (xyz[1] - box[1]) * (xyz[1] - box[1]) + (*xyz - box[0]) * (*xyz - box[0])) <
            h * 0.1) {
          ref_oct->nodes[node * 0x1b + lVar3] = insert_node;
        }
      }
    }
    else {
      for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
        RVar1 = ref_oct_child_bbox(bbox,(REF_INT)lVar3,box);
        if (RVar1 != 0) {
          pcVar4 = "bbox";
          uVar2 = 0x1c1;
LAB_0017238c:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",
                 uVar2,"ref_oct_set_node_at_node",1,pcVar4);
          return 1;
        }
        if (ref_oct->children[node * 8 + lVar3] == node) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",
                 0x1c2,"ref_oct_set_node_at_node","same");
          return 1;
        }
        RVar1 = ref_oct_set_node_at_node
                          (ref_oct,ref_oct->children[node * 8 + lVar3],box,insert_node,xyz);
        if (RVar1 != 0) {
          pcVar4 = "recurse";
          uVar2 = 0x1c6;
          goto LAB_0017238c;
        }
      }
    }
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_oct_set_node_at_node(REF_OCT ref_oct,
                                                   REF_INT node, REF_DBL *bbox,
                                                   REF_INT insert_node,
                                                   REF_DBL *xyz) {
  REF_DBL fuzz[6], point[6], expand = 1.01;
  REF_BOOL overlap;

  point[0] = xyz[0];
  point[1] = xyz[0];
  point[2] = xyz[1];
  point[3] = xyz[1];
  point[4] = xyz[2];
  point[5] = xyz[2];
  RSS(ref_oct_bbox_scale(bbox, expand, fuzz), "scale bbox");
  RSS(ref_oct_bbox_overlap(point, fuzz, &overlap), "overlap");
  if (!overlap) return REF_SUCCESS;

  if (ref_oct_leaf_node(ref_oct, node)) {
    REF_INT corner;
    REF_DBL h;
    RSS(ref_oct_bbox_diag(bbox, &h), "diag");
    for (corner = 0; corner < 27; corner++) {
      REF_DBL my_xyz[3], dist, tol = 0.1;
      RSS(ref_oct_bbox_corner(bbox, corner, my_xyz), "corner xyz");
      dist = sqrt(pow(xyz[0] - my_xyz[0], 2) + pow(xyz[1] - my_xyz[1], 2) +
                  pow(xyz[2] - my_xyz[2], 2));
      if (dist < tol * h) {
        ref_oct_c2n(ref_oct, corner, node) = insert_node;
      }
    }
  } else {
    REF_INT child_index;
    for (child_index = 0; child_index < 8; child_index++) {
      REF_DBL box[6];
      RSS(ref_oct_child_bbox(bbox, child_index, box), "bbox");
      RUS(node, ref_oct_child(ref_oct, child_index, node), "same");
      RSS(ref_oct_set_node_at_node(ref_oct,
                                   ref_oct_child(ref_oct, child_index, node),
                                   box, insert_node, xyz),
          "recurse");
    }
  }
  return REF_SUCCESS;
}